

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_async_generator_free(JSRuntime *rt,JSAsyncGeneratorData *s)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSRuntime *in_RSI;
  JSAsyncGeneratorRequest *req;
  list_head *el1;
  list_head *el;
  JSValueUnion in_stack_ffffffffffffffd8;
  JSValueUnion s_00;
  JSValueUnion rt_00;
  JSValueUnion JVar1;
  
  s_00 = (JSValueUnion)(in_RSI->context_list).next;
  JVar1 = *(JSValueUnion *)&((JSValueUnion *)((long)s_00.ptr + 8))->int32;
  while (rt_00 = JVar1, (list_head *)s_00.ptr != &in_RSI->context_list) {
    v.tag = (int64_t)in_RSI;
    v.u.ptr = s_00.ptr;
    JVar1 = s_00;
    JS_FreeValueRT((JSRuntime *)rt_00.ptr,v);
    v_00.tag = (int64_t)in_RSI;
    v_00.u.ptr = JVar1.ptr;
    JS_FreeValueRT((JSRuntime *)rt_00.ptr,v_00);
    v_01.tag = (int64_t)in_RSI;
    v_01.u.ptr = JVar1.ptr;
    JS_FreeValueRT((JSRuntime *)rt_00.ptr,v_01);
    v_02.tag = (int64_t)in_RSI;
    v_02.u.ptr = JVar1.ptr;
    JS_FreeValueRT((JSRuntime *)rt_00.ptr,v_02);
    js_free_rt((JSRuntime *)rt_00.ptr,s_00.ptr);
    in_stack_ffffffffffffffd8 = s_00;
    JVar1 = *(JSValueUnion *)&((JSValueUnion *)((long)rt_00.ptr + 8))->int32;
    s_00 = rt_00;
  }
  if ((*(int *)&(in_RSI->mf).js_free != 5) && (*(int *)&(in_RSI->mf).js_free != 4)) {
    async_func_free(in_RSI,(JSAsyncFunctionState *)s_00.ptr);
  }
  js_free_rt((JSRuntime *)rt_00.ptr,in_stack_ffffffffffffffd8.ptr);
  return;
}

Assistant:

static void js_async_generator_free(JSRuntime *rt,
                                    JSAsyncGeneratorData *s)
{
    struct list_head *el, *el1;
    JSAsyncGeneratorRequest *req;

    list_for_each_safe(el, el1, &s->queue) {
        req = list_entry(el, JSAsyncGeneratorRequest, link);
        JS_FreeValueRT(rt, req->result);
        JS_FreeValueRT(rt, req->promise);
        JS_FreeValueRT(rt, req->resolving_funcs[0]);
        JS_FreeValueRT(rt, req->resolving_funcs[1]);
        js_free_rt(rt, req);
    }
    if (s->state != JS_ASYNC_GENERATOR_STATE_COMPLETED &&
        s->state != JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
        async_func_free(rt, &s->func_state);
    }
    js_free_rt(rt, s);
}